

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

void __thiscall tcpp::StringInputStream::StringInputStream(StringInputStream *this,string *source)

{
  string *source_local;
  StringInputStream *this_local;
  
  (this->super_IInputStream)._vptr_IInputStream = (_func_int **)0x0;
  IInputStream::IInputStream(&this->super_IInputStream);
  (this->super_IInputStream)._vptr_IInputStream = (_func_int **)&PTR__StringInputStream_002bc970;
  std::__cxx11::string::string((string *)&this->mSourceStr,(string *)source);
  return;
}

Assistant:

StringInputStream::StringInputStream(const std::string& source) TCPP_NOEXCEPT:
		IInputStream(), mSourceStr(source)
	{
	}